

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_config_test.cc
# Opt level: O1

void __thiscall
(anonymous_namespace)::NonUniformTileConfigTestLarge::PreEncodeFrameHook
          (NonUniformTileConfigTestLarge *this)

{
  Encoder *in_RDX;
  VideoSource *in_RSI;
  
  anon_unknown.dwarf_c8a567::NonUniformTileConfigTestLarge::PreEncodeFrameHook
            ((NonUniformTileConfigTestLarge *)(this + -0x18),in_RSI,in_RDX);
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      encoder->Control(AOME_SET_CPUUSED, 5);
      encoder->Control(AOME_SET_ENABLEAUTOALTREF, 1);
      encoder->Control(AV1E_SET_SUPERBLOCK_SIZE,
                       tile_config_param_.sb_size == 64
                           ? AOM_SUPERBLOCK_SIZE_64X64
                           : AOM_SUPERBLOCK_SIZE_128X128);
    }
  }